

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wfc.cpp
# Opt level: O2

ObserveStatus __thiscall WFC::observe(WFC *this)

{
  uint uVar1;
  uint index;
  ObserveStatus OVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  uniform_real_distribution<double> dis;
  Array2D<unsigned_int> local_58;
  
  index = Wave::get_min_entropy(&this->wave,&this->gen);
  if (index == 0xfffffffe) {
    OVar2 = failure;
  }
  else if (index == 0xffffffff) {
    wave_to_output(&local_58,this);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&local_58.data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    OVar2 = success;
  }
  else {
    uVar6 = (ulong)index;
    dis._M_param._M_b = 0.0;
    for (uVar4 = 0; uVar3 = (ulong)uVar4, uVar3 < this->nb_patterns; uVar4 = uVar4 + 1) {
      if ((this->wave).data.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar3 + (this->wave).data.width * uVar6] == '\0')
      {
        dVar8 = 0.0;
      }
      else {
        dVar8 = (this->patterns_frequencies).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar3];
      }
      dis._M_param._M_b = dis._M_param._M_b + dVar8;
    }
    dis._M_param._M_a = 0.0;
    dVar8 = std::uniform_real_distribution<double>::operator()(&dis,&this->gen);
    uVar3 = this->nb_patterns;
    uVar4 = 0;
    do {
      uVar5 = (ulong)uVar4;
      uVar7 = uVar3 - 1;
      if (uVar3 <= uVar5) break;
      if ((this->wave).data.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar5 + (this->wave).data.width * uVar6] == '\0')
      {
        dVar9 = 0.0;
      }
      else {
        dVar9 = (this->patterns_frequencies).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar5];
      }
      dVar8 = dVar8 - dVar9;
      uVar4 = uVar4 + 1;
      uVar7 = uVar5;
    } while (0.0 < dVar8);
    for (uVar4 = 0; uVar5 = (ulong)uVar4, uVar5 < uVar3; uVar4 = uVar4 + 1) {
      if ((uVar7 != uVar5) ==
          ((this->wave).data.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar5 + (this->wave).data.width * uVar6] != '\0'
          )) {
        uVar1 = (this->wave).width;
        Propagator::add_to_propagator(&this->propagator,index / uVar1,index % uVar1,uVar4);
        Wave::set(&this->wave,index,uVar4,false);
        uVar3 = this->nb_patterns;
      }
    }
    OVar2 = to_continue;
  }
  return OVar2;
}

Assistant:

WFC::ObserveStatus WFC::observe() noexcept {
    // Get the cell with lowest entropy.
    int argmin = wave.get_min_entropy(gen);

    // If there is a contradiction, the algorithm has failed.
    if (argmin == -2) {
      return failure;
    }

    // If the lowest entropy is 0, then the algorithm has succeeded and
    // finished.
    if (argmin == -1) {
      wave_to_output();
      return success;
    }

    // Choose an element according to the pattern distribution
    double s = 0;
    for (unsigned k = 0; k < nb_patterns; k++) {
      s += wave.get(argmin, k) ? patterns_frequencies[k] : 0;
    }

    std::uniform_real_distribution<> dis(0, s);
    double random_value = dis(gen);
    size_t chosen_value = nb_patterns - 1;

    for (unsigned k = 0; k < nb_patterns; k++) {
      random_value -= wave.get(argmin, k) ? patterns_frequencies[k] : 0;
      if (random_value <= 0) {
        chosen_value = k;
        break;
      }
    }

    // And define the cell with the pattern.
    for (unsigned k = 0; k < nb_patterns; k++) {
      if (wave.get(argmin, k) != (k == chosen_value)) {
        propagator.add_to_propagator(argmin / wave.width, argmin % wave.width,
                                     k);
        wave.set(argmin, k, false);
      }
    }

    return to_continue;
  }